

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void blend_a64_mask_bn_w4_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,blend_unit_fn blend)

{
  uint in_ECX;
  long in_RDX;
  longlong extraout_RDX;
  uint in_ESI;
  long lVar1;
  void *in_RDI;
  long in_R8;
  uint in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar2 [16];
  __m128i alVar3;
  void *in_stack_00000008;
  __m128i v_res_w;
  __m128i v_m1_w;
  __m128i v_m0_w;
  __m128i v_m0_b;
  __m128i v_maxval_w;
  undefined8 local_c8;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined2 local_48;
  undefined2 uStack_46;
  undefined2 uStack_44;
  undefined2 uStack_42;
  
  local_88 = in_R8;
  local_78 = in_RDX;
  local_68 = in_RDI;
  do {
    alVar3 = xx_loadl_32(in_stack_00000008);
    auVar2._8_8_ = extraout_XMM0_Qb;
    auVar2._0_8_ = extraout_XMM0_Qa;
    auVar2 = pmovzxbw(auVar2,extraout_XMM0_Qa);
    local_c8 = auVar2._0_8_;
    local_48 = auVar2._0_2_;
    uStack_46 = auVar2._2_2_;
    uStack_44 = auVar2._4_2_;
    uStack_42 = auVar2._6_2_;
    lVar1 = local_88;
    (*(code *)v_m1_w[0])
              (local_c8,CONCAT26(0x40 - uStack_42,
                                 CONCAT24(0x40 - uStack_44,
                                          CONCAT22(0x40 - uStack_46,0x40 - local_48))),local_78,
               local_88,alVar3[1]);
    alVar3[1] = extraout_RDX;
    alVar3[0] = lVar1;
    xx_storel_64(local_68,alVar3);
    local_68 = (void *)((long)local_68 + (ulong)in_ESI * 2);
    local_78 = local_78 + (ulong)in_ECX * 2;
    local_88 = local_88 + (ulong)in_R9D * 2;
    in_stack_00000008 = (void *)((long)in_stack_00000008 + (ulong)(uint)v_res_w[0]);
    v_res_w[1]._0_4_ = (int)v_res_w[1] + -1;
  } while ((int)v_res_w[1] != 0);
  return;
}

Assistant:

static inline void blend_a64_mask_bn_w4_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h, blend_unit_fn blend) {
  const __m128i v_maxval_w = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);

  do {
    const __m128i v_m0_b = xx_loadl_32(mask);
    const __m128i v_m0_w = _mm_cvtepu8_epi16(v_m0_b);
    const __m128i v_m1_w = _mm_sub_epi16(v_maxval_w, v_m0_w);

    const __m128i v_res_w = blend(src0, src1, v_m0_w, v_m1_w);

    xx_storel_64(dst, v_res_w);

    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += mask_stride;
  } while (--h);
}